

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mprpc.cpp
# Opt level: O1

void __thiscall
mprpc::MpRpcServer::on_recv
          (MpRpcServer *this,shared_ptr<mprpc::ClientConnection> *conn,char *data,size_t size)

{
  msgpack_object_union *pmVar1;
  pointer pcVar2;
  uint uVar3;
  undefined8 *puVar4;
  element_type *peVar5;
  undefined5 uVar6;
  undefined3 uVar7;
  iterator iVar8;
  mapped_type *pmVar9;
  undefined8 uVar10;
  char *pcVar11;
  uint16_t val;
  ushort uVar12;
  undefined8 uVar13;
  MsgPackPacker pk;
  unique_lock<std::recursive_mutex> lock;
  shared_ptr<mprpc::MpRpcMessage> rpcmsg;
  undefined1 local_c8 [32];
  msgpack_packer_write local_a8;
  uint local_94;
  unique_lock<std::recursive_mutex> local_90;
  undefined1 local_80 [32];
  undefined1 local_60 [16];
  undefined8 local_50;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_48;
  msgpack_object_union local_40;
  
  MpRpcMessage::parse((MpRpcMessage *)local_80,data,size);
  uVar13 = local_80._0_8_;
  if ((((pointer)local_80._0_8_ != (pointer)0x0) && (*(int *)(local_80._0_8_ + 200) != 0)) &&
     (*(long *)(local_80._0_8_ + 8) != 0)) {
    local_90._M_device = (mutex_type *)(this + 8);
    local_90._M_owns = false;
    std::unique_lock<std::recursive_mutex>::lock(&local_90);
    local_90._M_owns = true;
    (**(code **)(*(long *)(conn->
                          super___shared_ptr<mprpc::ClientConnection,_(__gnu_cxx::_Lock_policy)2>).
                          _M_ptr + 0x10))(local_c8);
    iVar8 = std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mprpc::ClientConnection>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mprpc::ClientConnection>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mprpc::ClientConnection>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mprpc::ClientConnection>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                    *)(this + 0x30),(key_type *)local_c8);
    pcVar2 = local_c8 + 0x10;
    if ((pointer)local_c8._0_8_ != pcVar2) {
      operator_delete((void *)local_c8._0_8_);
    }
    if (iVar8.
        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mprpc::ClientConnection>_>,_true>
        ._M_cur == (__node_type *)0x0) {
      (**(code **)(*(long *)(conn->
                            super___shared_ptr<mprpc::ClientConnection,_(__gnu_cxx::_Lock_policy)2>)
                            ._M_ptr + 0x10))(local_c8);
      pmVar9 = std::__detail::
               _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mprpc::ClientConnection>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mprpc::ClientConnection>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mprpc::ClientConnection>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mprpc::ClientConnection>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                             *)(this + 0x30),(key_type *)local_c8);
      (pmVar9->super___shared_ptr<mprpc::ClientConnection,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
           (conn->super___shared_ptr<mprpc::ClientConnection,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                (&(pmVar9->super___shared_ptr<mprpc::ClientConnection,_(__gnu_cxx::_Lock_policy)2>).
                  _M_refcount,
                 &(conn->super___shared_ptr<mprpc::ClientConnection,_(__gnu_cxx::_Lock_policy)2>).
                  _M_refcount);
      if ((pointer)local_c8._0_8_ != pcVar2) {
        operator_delete((void *)local_c8._0_8_);
      }
    }
    std::unique_lock<std::recursive_mutex>::~unique_lock(&local_90);
    uVar10 = std::chrono::_V2::system_clock::now();
    *(undefined8 *)(uVar13 + 0xd0) = uVar10;
    if (*(long *)(uVar13 + 8) == 0) {
      local_c8._0_8_ = (pointer)0x0;
      local_c8._8_8_ = (char *)0x0;
      local_c8._16_6_ = 0;
      local_c8._22_2_ = 0;
      local_c8._24_6_ = SUB86(local_c8,0);
      local_c8[0x1e] = (undefined1)((ulong)local_c8 >> 0x30);
      local_c8[0x1f] = (undefined1)((ulong)local_c8 >> 0x38);
      local_a8 = msgpack_sbuffer_write;
      pcVar11 = (char *)realloc((void *)0x0,0x2000);
      if (pcVar11 != (char *)0x0) {
        local_c8._16_6_ = 0x2000;
        local_c8._22_2_ = 0;
        pcVar11[local_c8._0_8_] = -0x7e;
        local_c8._0_8_ = local_c8._0_8_ + 1;
        local_c8._8_8_ = pcVar11;
      }
      uVar3 = *(uint *)(uVar13 + 200);
      local_90._M_device = (mutex_type *)CONCAT71(local_90._M_device._1_7_,0xa2);
      (*local_a8)((void *)CONCAT17(local_c8[0x1f],CONCAT16(local_c8[0x1e],local_c8._24_6_)),
                  (char *)&local_90,1);
      (*local_a8)((void *)CONCAT17(local_c8[0x1f],CONCAT16(local_c8[0x1e],local_c8._24_6_)),"id",2);
      uVar12 = (ushort)uVar3;
      local_94._0_1_ = (undefined1)uVar3;
      uVar7 = local_90._M_device._5_3_;
      uVar6 = local_90._M_device._3_5_;
      local_94 = uVar3;
      if ((int)uVar3 < -0x20) {
        if ((int)uVar3 < -0x8000) {
          local_90._M_device._0_5_ =
               CONCAT41(uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 |
                        uVar3 << 0x18,0xd2);
          local_90._M_device = (mutex_type *)CONCAT35(uVar7,local_90._M_device._0_5_);
          (*local_a8)((void *)CONCAT17(local_c8[0x1f],CONCAT16(local_c8[0x1e],local_c8._24_6_)),
                      (char *)&local_90,5);
        }
        else if ((int)uVar3 < -0x80) {
          local_90._M_device._0_3_ = CONCAT21(uVar12 << 8 | uVar12 >> 8,0xd1);
          local_90._M_device = (mutex_type *)CONCAT53(uVar6,local_90._M_device._0_3_);
          (*local_a8)((void *)CONCAT17(local_c8[0x1f],CONCAT16(local_c8[0x1e],local_c8._24_6_)),
                      (char *)&local_90,3);
        }
        else {
          local_90._M_device._0_2_ = CONCAT11((undefined1)local_94,0xd0);
          (*local_a8)((void *)CONCAT17(local_c8[0x1f],CONCAT16(local_c8[0x1e],local_c8._24_6_)),
                      (char *)&local_90,2);
        }
      }
      else if ((int)uVar3 < 0x80) {
        (*local_a8)((void *)CONCAT17(local_c8[0x1f],CONCAT16(local_c8[0x1e],local_c8._24_6_)),
                    (char *)&local_94,1);
      }
      else if ((int)uVar3 < 0x100) {
        local_90._M_device._0_2_ = CONCAT11((undefined1)local_94,0xcc);
        (*local_a8)((void *)CONCAT17(local_c8[0x1f],CONCAT16(local_c8[0x1e],local_c8._24_6_)),
                    (char *)&local_90,2);
      }
      else if ((int)uVar3 < 0x10000) {
        local_90._M_device._0_3_ = CONCAT21(uVar12 << 8 | uVar12 >> 8,0xcd);
        local_90._M_device = (mutex_type *)CONCAT53(uVar6,local_90._M_device._0_3_);
        (*local_a8)((void *)CONCAT17(local_c8[0x1f],CONCAT16(local_c8[0x1e],local_c8._24_6_)),
                    (char *)&local_90,3);
      }
      else {
        local_90._M_device._0_5_ =
             CONCAT41(uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 |
                      uVar3 << 0x18,0xce);
        local_90._M_device = (mutex_type *)CONCAT35(uVar7,local_90._M_device._0_5_);
        (*local_a8)((void *)CONCAT17(local_c8[0x1f],CONCAT16(local_c8[0x1e],local_c8._24_6_)),
                    (char *)&local_90,5);
      }
      local_90._M_device._0_1_ = 0xa5;
      (*local_a8)((void *)CONCAT17(local_c8[0x1f],CONCAT16(local_c8[0x1e],local_c8._24_6_)),
                  (char *)&local_90,1);
      (*local_a8)((void *)CONCAT17(local_c8[0x1f],CONCAT16(local_c8[0x1e],local_c8._24_6_)),"error",
                  5);
      local_90._M_device._0_1_ = 0x82;
      (*local_a8)((void *)CONCAT17(local_c8[0x1f],CONCAT16(local_c8[0x1e],local_c8._24_6_)),
                  (char *)&local_90,1);
      local_90._M_device = (mutex_type *)CONCAT71(local_90._M_device._1_7_,0xa4);
      (*local_a8)((void *)CONCAT17(local_c8[0x1f],CONCAT16(local_c8[0x1e],local_c8._24_6_)),
                  (char *)&local_90,1);
      (*local_a8)((void *)CONCAT17(local_c8[0x1f],CONCAT16(local_c8[0x1e],local_c8._24_6_)),"code",4
                 );
      local_90._M_device = (mutex_type *)CONCAT44(local_90._M_device._4_4_,0xffffffff);
      (*local_a8)((void *)CONCAT17(local_c8[0x1f],CONCAT16(local_c8[0x1e],local_c8._24_6_)),
                  (char *)&local_90,1);
      MsgPackPacker::pack_map_item((MsgPackPacker *)local_c8,"message","empty method");
      peVar5 = (conn->super___shared_ptr<mprpc::ClientConnection,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr;
      (**(code **)(*(long *)peVar5 + 0x20))(peVar5,local_c8._8_8_,local_c8._0_8_);
      free((void *)local_c8._8_8_);
    }
    else {
      puVar4 = *(undefined8 **)this;
      peVar5 = (conn->super___shared_ptr<mprpc::ClientConnection,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr;
      if (puVar4 == (undefined8 *)0x0) {
        local_60._8_8_ =
             (conn->super___shared_ptr<mprpc::ClientConnection,_(__gnu_cxx::_Lock_policy)2>).
             _M_refcount._M_pi;
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_60._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_60._8_8_)->_M_use_count =
                 ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_60._8_8_)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_60._8_8_)->_M_use_count =
                 ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_60._8_8_)->_M_use_count + 1;
          }
        }
        local_80._16_8_ = local_80._0_8_;
        local_80._24_8_ = local_80._8_8_;
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_80._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            *(_Atomic_word *)(local_80._8_8_ + 8) = *(_Atomic_word *)(local_80._8_8_ + 8) + 1;
            UNLOCK();
          }
          else {
            *(_Atomic_word *)(local_80._8_8_ + 8) = *(_Atomic_word *)(local_80._8_8_ + 8) + 1;
          }
        }
        local_c8._16_6_ = 0x776f6e6b6e75;
        local_c8._22_2_ = 0x206e;
        local_c8._24_6_ = 0x646f6874656d;
        local_c8._8_8_ = (char *)0xe;
        local_c8[0x1e] = '\0';
        local_c8._0_8_ = pcVar2;
        local_60._0_8_ = peVar5;
        send_error_rsp(this,(shared_ptr<mprpc::ClientConnection> *)local_60,
                       (shared_ptr<mprpc::MpRpcMessage> *)(local_80 + 0x10),-1,(string *)local_c8);
        if ((pointer)local_c8._0_8_ != pcVar2) {
          operator_delete((void *)local_c8._0_8_);
        }
        uVar13 = local_60._8_8_;
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_80._24_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_80._24_8_);
          uVar13 = local_60._8_8_;
        }
      }
      else {
        local_40.array.ptr =
             (msgpack_object *)
             (conn->super___shared_ptr<mprpc::ClientConnection,_(__gnu_cxx::_Lock_policy)2>).
             _M_refcount._M_pi;
        if ((msgpack_object_kv *)local_40.array.ptr != (msgpack_object_kv *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            pmVar1 = &((local_40.map.ptr)->key).via;
            (pmVar1->array).size = (pmVar1->array).size + 1;
            UNLOCK();
          }
          else {
            pmVar1 = &((local_40.map.ptr)->key).via;
            (pmVar1->array).size = (pmVar1->array).size + 1;
          }
        }
        local_50 = local_80._0_8_;
        local_48 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_80._8_8_;
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_80._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            *(_Atomic_word *)(local_80._8_8_ + 8) = *(_Atomic_word *)(local_80._8_8_ + 8) + 1;
            UNLOCK();
          }
          else {
            *(_Atomic_word *)(local_80._8_8_ + 8) = *(_Atomic_word *)(local_80._8_8_ + 8) + 1;
          }
        }
        local_40.u64 = (uint64_t)peVar5;
        (**(code **)*puVar4)(puVar4,&local_40,&local_50);
        uVar13 = local_40.map.ptr;
        if (local_48 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_48);
          uVar13 = local_40.map.ptr;
        }
      }
      if ((msgpack_object *)uVar13 != (msgpack_object *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar13);
      }
    }
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_80._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_80._8_8_);
  }
  return;
}

Assistant:

void MpRpcServer::on_recv(shared_ptr<ClientConnection> conn, const char* data, size_t size)
    {
        auto rpcmsg = MpRpcMessage::parse(data, size);
        if (!rpcmsg ||
            rpcmsg->id == 0 ||
            rpcmsg->method.empty())
        {
            return;
        }

        {
            unique_lock<recursive_mutex> lock(m_conn_map_lock);
            auto it = m_conn_map.find(conn->id());
            if (it == m_conn_map.end()) m_conn_map[conn->id()] = conn;
        }

        rpcmsg->recv_time = system_clock::now();

        if (rpcmsg->method.size()) {
            if (m_callback)
                m_callback->on_call(conn, rpcmsg);
            else {
                send_error_rsp(conn, rpcmsg, -1, "unknown method");
            }
        }
        else {
            MsgPackPacker pk;
            pk.pack_map(2);
            pk.pack_map_item ("id", rpcmsg->id);
            pk.pack_string   ("error");
            // error -> [ code, message]
            pk.pack_map(2);
            pk.pack_map_item ("code", -1);
            pk.pack_map_item ("message", "empty method");

            conn->send(pk.sb.data, pk.sb.size);
        }
    }